

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O0

uint32_t __thiscall spirv_cross::CFG::find_loop_dominator(CFG *this,uint32_t block_id)

{
  bool bVar1;
  pointer pvVar2;
  BlockID *pBVar3;
  uint *puVar4;
  SPIRBlock *pSVar5;
  bool local_89;
  bool local_79;
  SPIRBlock *block;
  SPIRBlock *local_60;
  SPIRBlock *pred_block;
  uint *pred;
  uint *__end2;
  uint *__begin2;
  SmallVector<unsigned_int,_8UL> *__range2;
  bool ignore_loop_header;
  _Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
  _Stack_30;
  uint32_t pred_block_id;
  _Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
  local_28;
  const_iterator itr;
  uint32_t block_id_local;
  CFG *this_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
  ._M_cur._4_4_ = block_id;
  do {
    if (itr.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
        ._M_cur._4_4_ == 0xffffffff) {
      return 0xffffffff;
    }
    local_28._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>_>
         ::find(&this->preceding_edges,
                (key_type *)
                ((long)&itr.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                        ._M_cur + 4));
    _Stack_30._M_cur =
         (__node_type *)
         ::std::
         end<std::unordered_map<unsigned_int,spirv_cross::SmallVector<unsigned_int,8ul>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spirv_cross::SmallVector<unsigned_int,8ul>>>>>
                   (&this->preceding_edges);
    bVar1 = ::std::__detail::operator==(&local_28,&stack0xffffffffffffffd0);
    if (bVar1) {
      return 0xffffffff;
    }
    pvVar2 = ::std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false,_false>
                           *)&local_28);
    bVar1 = VectorView<unsigned_int>::empty(&(pvVar2->second).super_VectorView<unsigned_int>);
    if (bVar1) {
      return 0xffffffff;
    }
    __range2._4_4_ = 0xffffffff;
    __range2._3_1_ = 0;
    pvVar2 = ::std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false,_false>
                           *)&local_28);
    __begin2 = (uint *)&pvVar2->second;
    __end2 = VectorView<unsigned_int>::begin((VectorView<unsigned_int> *)__begin2);
    pred = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)__begin2);
    for (; __end2 != pred; __end2 = __end2 + 1) {
      pred_block = (SPIRBlock *)__end2;
      local_60 = Compiler::get<spirv_cross::SPIRBlock>(this->compiler,*__end2);
      local_79 = false;
      if (local_60->merge == MergeLoop) {
        pBVar3 = &local_60->merge_block;
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)((long)&block + 4),
                   itr.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                   ._M_cur._4_4_);
        local_79 = TypedID<(spirv_cross::Types)6>::operator==
                             (pBVar3,(TypedID<(spirv_cross::Types)0> *)((long)&block + 4));
      }
      if (local_79 != false) {
        __range2._4_4_ = *(uint32_t *)&(pred_block->super_IVariant)._vptr_IVariant;
        __range2._3_1_ = 1;
        break;
      }
      local_89 = false;
      if (local_60->merge == MergeSelection) {
        pBVar3 = &local_60->next_block;
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)&block,
                   itr.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                   ._M_cur._4_4_);
        local_89 = TypedID<(spirv_cross::Types)6>::operator==
                             (pBVar3,(TypedID<(spirv_cross::Types)0> *)&block);
      }
      if (local_89 != false) {
        __range2._4_4_ = *(uint32_t *)&(pred_block->super_IVariant)._vptr_IVariant;
        break;
      }
    }
    if (__range2._4_4_ == 0xffffffff) {
      pvVar2 = ::std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false,_false>
                             *)&local_28);
      puVar4 = VectorView<unsigned_int>::front(&(pvVar2->second).super_VectorView<unsigned_int>);
      __range2._4_4_ = *puVar4;
    }
    itr.
    super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
    ._M_cur._4_4_ = __range2._4_4_;
    if ((((__range2._3_1_ & 1) == 0) && (__range2._4_4_ != 0)) &&
       (pSVar5 = Compiler::get<spirv_cross::SPIRBlock>(this->compiler,__range2._4_4_),
       pSVar5->merge == MergeLoop)) {
      return itr.
             super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
             ._M_cur._4_4_;
    }
  } while( true );
}

Assistant:

uint32_t CFG::find_loop_dominator(uint32_t block_id) const
{
	while (block_id != SPIRBlock::NoDominator)
	{
		auto itr = preceding_edges.find(block_id);
		if (itr == end(preceding_edges))
			return SPIRBlock::NoDominator;
		if (itr->second.empty())
			return SPIRBlock::NoDominator;

		uint32_t pred_block_id = SPIRBlock::NoDominator;
		bool ignore_loop_header = false;

		// If we are a merge block, go directly to the header block.
		// Only consider a loop dominator if we are branching from inside a block to a loop header.
		// NOTE: In the CFG we forced an edge from header to merge block always to support variable scopes properly.
		for (auto &pred : itr->second)
		{
			auto &pred_block = compiler.get<SPIRBlock>(pred);
			if (pred_block.merge == SPIRBlock::MergeLoop && pred_block.merge_block == ID(block_id))
			{
				pred_block_id = pred;
				ignore_loop_header = true;
				break;
			}
			else if (pred_block.merge == SPIRBlock::MergeSelection && pred_block.next_block == ID(block_id))
			{
				pred_block_id = pred;
				break;
			}
		}

		// No merge block means we can just pick any edge. Loop headers dominate the inner loop, so any path we
		// take will lead there.
		if (pred_block_id == SPIRBlock::NoDominator)
			pred_block_id = itr->second.front();

		block_id = pred_block_id;

		if (!ignore_loop_header && block_id)
		{
			auto &block = compiler.get<SPIRBlock>(block_id);
			if (block.merge == SPIRBlock::MergeLoop)
				return block_id;
		}
	}

	return block_id;
}